

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2018.h
# Opt level: O1

void __thiscall DRAG<RemSP>::PerformLabeling(DRAG<RemSP> *this)

{
  long lVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Mat1b *pMVar6;
  Mat1i *pMVar7;
  uint *puVar8;
  uint *puVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  undefined4 uVar18;
  ulong uVar19;
  int iVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  uint local_e8;
  Mat local_90 [96];
  ulong uVar20;
  
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar11 = *(uint *)&pMVar6->field_0x8;
  uVar14 = (ulong)uVar11;
  iVar21 = *(int *)&pMVar6->field_0xc;
  lVar27 = (long)iVar21;
  cv::Mat::Mat(local_90,**(int **)&pMVar6->field_0x40,(*(int **)&pMVar6->field_0x40)[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar3 = *(int *)&pMVar6->field_0x8;
  iVar4 = *(int *)&pMVar6->field_0xc;
  RemSP::P_ = (uint *)operator_new__((ulong)(((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) *
                                             ((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) + 1) << 2);
  *RemSP::P_ = 0;
  RemSP::length_ = 1;
  if (0 < (int)uVar11) {
    uVar19 = 0;
    do {
      if (0 < iVar21) {
        pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar22 = **(long **)&pMVar6->field_0x48;
        lVar16 = lVar22 * uVar19 + *(long *)&pMVar6->field_0x10;
        lVar28 = lVar16 - lVar22;
        lVar12 = lVar28 - lVar22;
        lVar22 = lVar22 + lVar16;
        lVar24 = **(long **)&pMVar7->field_0x48;
        lVar29 = lVar24 * uVar19 + *(long *)&pMVar7->field_0x10;
        lVar24 = lVar29 + lVar24 * -2;
        uVar25 = uVar19 | 1;
        uVar32 = 0;
        do {
          if (*(char *)(lVar16 + uVar32) == '\0') {
            if ((uVar25 < uVar14) && (*(char *)(lVar22 + uVar32) != '\0')) {
              uVar13 = uVar32 | 1;
              if (((long)uVar13 < lVar27) && (*(char *)(lVar16 + uVar13) != '\0')) {
                if (uVar32 == 0) {
LAB_0011c3f3:
                  if (((uVar19 == 0) || (lVar27 <= (long)(uVar32 | 1))) ||
                     (*(char *)(lVar28 + (uVar32 | 1)) == '\0')) {
                    if (((uVar19 != 0) && ((long)(uVar32 + 2) < lVar27)) &&
                       (*(char *)(lVar28 + uVar32 + 2) != '\0')) {
                      if (*(char *)(lVar28 + uVar32) == '\0') goto LAB_0011c7a4;
                      goto LAB_0011c5ba;
                    }
                    if ((uVar19 == 0) || (*(char *)(lVar28 + uVar32) == '\0')) goto LAB_0011c661;
                  }
                  goto LAB_0011c5f1;
                }
                if (*(char *)((uVar32 - 1) + lVar16) != '\0') {
                  if ((uVar19 == 0) || (*(char *)(lVar28 + uVar13) == '\0')) goto LAB_0011c456;
                  goto LAB_0011c341;
                }
                if (*(char *)(lVar22 + -1 + uVar32) == '\0') goto LAB_0011c3f3;
                if ((uVar19 == 0) || (*(char *)(lVar28 + uVar13) == '\0')) {
                  if (((uVar19 == 0) || (lVar27 <= (long)(uVar32 + 2))) ||
                     (*(char *)(lVar28 + uVar32 + 2) == '\0')) {
                    if ((uVar19 == 0) || (*(char *)(lVar28 + uVar32) == '\0')) goto LAB_0011c863;
                    cVar2 = *(char *)((uVar32 - 2) + lVar16);
                    goto joined_r0x0011c85b;
                  }
                  if (*(char *)(lVar12 + uVar13) == '\0') {
                    if (*(char *)(lVar28 + uVar32) != '\0') {
                      if (*(char *)((uVar32 - 2) + lVar16) == '\0') goto LAB_0011c971;
                      if (*(char *)(lVar28 + -1 + uVar32) == '\0') goto LAB_0011c93d;
                      goto LAB_0011c79a;
                    }
                    goto LAB_0011c493;
                  }
                }
                if (*(char *)((uVar32 - 2) + lVar16) != '\0') {
LAB_0011c4e3:
                  if ((uVar32 != 0 && uVar19 != 0) && (*(char *)(lVar28 + -1 + uVar32) != '\0')) {
LAB_0011c6d0:
                    if (uVar19 != 0) {
                      if (*(char *)(lVar28 + uVar32) != '\0') goto LAB_0011c612;
                      goto LAB_0011c56f;
                    }
                    goto LAB_0011c715;
                  }
LAB_0011c4ff:
                  if ((uVar32 != 0 && uVar19 != 0) && (*(char *)(lVar28 + -2 + uVar32) != '\0')) {
                    if (*(char *)(lVar12 + -1 + uVar32) != '\0') goto LAB_0011c6d0;
                    goto LAB_0011c715;
                  }
                }
LAB_0011c825:
                uVar10 = *(uint *)(lVar24 + uVar32 * 4);
LAB_0011c829:
                uVar23 = *(uint *)(lVar29 + -8 + uVar32 * 4);
                goto LAB_0011c82e;
              }
              if ((uVar32 != 0) &&
                 ((*(char *)((uVar32 - 1) + lVar22) != '\0' ||
                  (*(char *)(lVar16 + -1 + uVar32) != '\0')))) goto LAB_0011c863;
LAB_0011c661:
              RemSP::P_[RemSP::length_] = RemSP::length_;
              uVar10 = RemSP::length_ + 1;
              *(uint *)(lVar29 + uVar32 * 4) = RemSP::length_;
              RemSP::length_ = uVar10;
            }
            else {
              uVar13 = uVar32 | 1;
              if ((long)uVar13 < lVar27) {
                if (*(char *)(lVar16 + uVar13) != '\0') goto LAB_0011c3f3;
                if ((uVar25 < uVar14) && (*(char *)(lVar22 + uVar13) != '\0')) goto LAB_0011c661;
              }
              *(undefined4 *)(lVar29 + uVar32 * 4) = 0;
            }
          }
          else {
            if (uVar32 == 0) {
LAB_0011c535:
              uVar13 = uVar32 | 1;
              if ((uVar19 == 0) ||
                 ((lVar27 <= (long)uVar13 || (*(char *)(lVar28 + uVar13) == '\0')))) {
                if (((long)uVar13 < lVar27) &&
                   ((((*(char *)(lVar16 + uVar13) != '\0' && (uVar19 != 0)) &&
                     ((long)(uVar32 + 2) < lVar27)) && (*(char *)(lVar28 + uVar32 + 2) != '\0')))) {
                  if (*(char *)(lVar28 + uVar32) == '\0') {
                    if ((uVar32 == 0) || (*(char *)(lVar28 + -1 + uVar32) == '\0')) {
LAB_0011c7a4:
                      uVar10 = *(uint *)(lVar24 + 8 + uVar32 * 4);
                      goto LAB_0011c868;
                    }
                    if (*(char *)(lVar12 + uVar13) == '\0') goto LAB_0011c79a;
                    goto LAB_0011c56f;
                  }
LAB_0011c5ba:
                  if (((uVar19 == 0) || (lVar27 <= (long)(uVar32 | 1))) ||
                     (*(char *)(lVar12 + (uVar32 | 1)) == '\0')) {
                    uVar10 = *(uint *)(lVar24 + uVar32 * 4);
LAB_0011c5da:
                    uVar23 = *(uint *)(lVar24 + 8 + uVar32 * 4);
                    goto LAB_0011c82e;
                  }
                }
                else if ((uVar19 == 0) || (*(char *)(lVar28 + uVar32) == '\0')) {
                  if ((uVar19 == 0 || uVar32 == 0) || (*(char *)(lVar28 + -1 + uVar32) == '\0'))
                  goto LAB_0011c661;
                  goto LAB_0011c612;
                }
              }
              else if (((*(char *)(lVar28 + uVar32) == '\0') && (uVar32 != 0)) &&
                      (*(char *)(lVar28 + -1 + uVar32) != '\0')) {
LAB_0011c56f:
                if ((uVar19 != 0) && (*(char *)(lVar12 + uVar32) != '\0')) goto LAB_0011c612;
LAB_0011c715:
                uVar10 = *(uint *)(lVar24 + -8 + uVar32 * 4);
                uVar23 = *(uint *)(lVar24 + uVar32 * 4);
                goto LAB_0011c82e;
              }
LAB_0011c5f1:
              uVar10 = *(uint *)(lVar24 + uVar32 * 4);
            }
            else if (*(char *)(lVar16 + -1 + uVar32) == '\0') {
              if ((uVar14 <= uVar25) || (*(char *)(lVar22 + -1 + uVar32) == '\0'))
              goto LAB_0011c535;
              uVar13 = uVar32 | 1;
              if (((uVar19 != 0) && ((long)uVar13 < lVar27)) && (*(char *)(lVar28 + uVar13) != '\0')
                 ) {
                if (*(char *)((uVar32 - 2) + lVar16) != '\0') goto LAB_0011c4e3;
                if ((*(char *)(lVar28 + uVar32) == '\0') &&
                   (*(char *)(lVar28 + -1 + uVar32) != '\0')) {
LAB_0011c886:
                  if ((uVar19 == 0) || (*(char *)(lVar12 + uVar32) == '\0')) {
                    uVar10 = *(uint *)(lVar24 + -8 + uVar32 * 4);
                    uVar23 = *(uint *)(lVar24 + uVar32 * 4);
LAB_0011c8d5:
                    uVar10 = RemSP::Merge(uVar10,uVar23);
                    uVar23 = *(uint *)(lVar29 + -8 + uVar32 * 4);
                  }
                  else {
                    uVar10 = *(uint *)(lVar24 + -8 + uVar32 * 4);
LAB_0011c7fa:
                    uVar23 = *(uint *)(lVar29 + -8 + uVar32 * 4);
                  }
LAB_0011c7ff:
                  uVar10 = RemSP::Merge(uVar10,uVar23);
                  *(uint *)(lVar29 + uVar32 * 4) = uVar10;
                  goto LAB_0011c86c;
                }
                goto LAB_0011c825;
              }
              if (((lVar27 <= (long)uVar13) || (*(char *)(lVar16 + uVar13) == '\0')) ||
                 ((uVar19 == 0 ||
                  ((lVar27 <= (long)(uVar32 + 2) || (*(char *)(lVar28 + uVar32 + 2) == '\0')))))) {
                if (uVar19 == 0) goto LAB_0011c863;
                if (*(char *)(lVar28 + -1 + uVar32) == '\0') {
                  if (*(char *)(lVar28 + uVar32) == '\0') goto LAB_0011c863;
                  if (*(char *)((uVar32 - 2) + lVar16) == '\0') goto LAB_0011c825;
                  goto LAB_0011c7c2;
                }
                uVar10 = *(uint *)(lVar24 + -8 + uVar32 * 4);
                if (*(char *)(lVar16 + -2 + uVar32) != '\0') {
                  *(uint *)(lVar29 + uVar32 * 4) = uVar10;
                  goto LAB_0011c86c;
                }
                goto LAB_0011c829;
              }
              if (*(char *)((uVar32 - 2) + lVar16) != '\0') {
                if (*(char *)(lVar28 + -1 + uVar32) == '\0') {
                  if (*(char *)(lVar12 + uVar13) == '\0') {
                    if (*(char *)(lVar28 + uVar32) != '\0') {
LAB_0011c93d:
                      if ((uVar32 == 0 || uVar19 == 0) || (*(char *)(lVar28 + -2 + uVar32) == '\0'))
                      {
LAB_0011c971:
                        uVar10 = *(uint *)(lVar24 + uVar32 * 4);
                        goto LAB_0011c975;
                      }
                      if (*(char *)(lVar12 + -1 + uVar32) == '\0') {
                        uVar10 = *(uint *)(lVar24 + uVar32 * 4);
                        goto LAB_0011c8c5;
                      }
                      uVar10 = *(uint *)(lVar24 + -8 + uVar32 * 4);
                      uVar23 = *(uint *)(lVar24 + 8 + uVar32 * 4);
                      goto LAB_0011c7ff;
                    }
                    goto LAB_0011c493;
                  }
                  goto LAB_0011c4ff;
                }
                if (*(char *)(lVar12 + uVar13) != '\0') goto LAB_0011c6d0;
LAB_0011c79a:
                uVar10 = *(uint *)(lVar24 + -8 + uVar32 * 4);
                goto LAB_0011c5da;
              }
              if (*(char *)(lVar28 + uVar32) != '\0') {
                uVar10 = *(uint *)(lVar24 + uVar32 * 4);
                if (*(char *)(lVar12 + uVar13) == '\0') {
LAB_0011c8c5:
                  uVar23 = *(uint *)(lVar24 + 8 + uVar32 * 4);
                  goto LAB_0011c8d5;
                }
                goto LAB_0011c7fa;
              }
              if (*(char *)(lVar28 + -1 + uVar32) == '\0') {
LAB_0011c493:
                uVar10 = *(uint *)(lVar24 + 8 + uVar32 * 4);
                goto LAB_0011c829;
              }
              if (*(char *)(lVar12 + uVar13) != '\0') goto LAB_0011c886;
              uVar10 = *(uint *)(lVar24 + -8 + uVar32 * 4);
LAB_0011c975:
              uVar10 = RemSP::Merge(uVar10,*(uint *)(lVar24 + 8 + uVar32 * 4));
              uVar23 = *(uint *)(lVar29 + -8 + uVar32 * 4);
LAB_0011c82e:
              uVar10 = RemSP::Merge(uVar10,uVar23);
            }
            else {
              uVar13 = uVar32 | 1;
              if (((uVar19 == 0) || (lVar27 <= (long)uVar13)) ||
                 (*(char *)(lVar28 + uVar13) == '\0')) {
                if (((long)uVar13 < lVar27) && (*(char *)(lVar16 + uVar13) != '\0')) {
LAB_0011c456:
                  if ((uVar19 != 0) &&
                     (((long)(uVar32 + 2) < lVar27 && (*(char *)(lVar28 + uVar32 + 2) != '\0')))) {
                    if ((lVar27 <= (long)(uVar32 | 1)) || (*(char *)(lVar12 + (uVar32 | 1)) == '\0')
                       ) goto LAB_0011c493;
                    goto LAB_0011c341;
                  }
                }
LAB_0011c863:
                uVar10 = *(uint *)(lVar29 + -8 + uVar32 * 4);
              }
              else {
LAB_0011c341:
                if (uVar19 == 0) goto LAB_0011c825;
                if (*(char *)(lVar28 + uVar32) != '\0') goto LAB_0011c5f1;
                cVar2 = *(char *)(lVar12 + uVar32);
joined_r0x0011c85b:
                if (cVar2 == '\0') goto LAB_0011c825;
                if ((uVar32 == 0 || uVar19 == 0) || (*(char *)(lVar28 + -1 + uVar32) == '\0')) {
LAB_0011c7c2:
                  if ((uVar32 == 0 || uVar19 == 0) || (*(char *)(lVar28 + -2 + uVar32) == '\0')) {
                    uVar10 = *(uint *)(lVar24 + uVar32 * 4);
                    goto LAB_0011c7fa;
                  }
                  uVar10 = *(uint *)(lVar24 + -8 + uVar32 * 4);
                  if (*(char *)(lVar12 + -1 + uVar32) == '\0') {
                    uVar23 = *(uint *)(lVar24 + uVar32 * 4);
                    goto LAB_0011c7ff;
                  }
                  *(uint *)(lVar29 + uVar32 * 4) = uVar10;
                  goto LAB_0011c86c;
                }
LAB_0011c612:
                uVar10 = *(uint *)(lVar24 + -8 + uVar32 * 4);
              }
            }
LAB_0011c868:
            *(uint *)(lVar29 + uVar32 * 4) = uVar10;
          }
LAB_0011c86c:
          uVar32 = uVar32 + 2;
        } while ((long)uVar32 < lVar27);
      }
      uVar19 = uVar19 + 2;
    } while ((int)uVar19 < (int)uVar11);
  }
  puVar8 = RemSP::P_;
  uVar11 = 1;
  if (1 < RemSP::length_) {
    uVar11 = 1;
    uVar14 = 1;
    do {
      if (puVar8[uVar14] < uVar14) {
        puVar8[uVar14] = puVar8[puVar8[uVar14]];
      }
      else {
        puVar8[uVar14] = uVar11;
        uVar11 = uVar11 + 1;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < RemSP::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar11;
  puVar8 = RemSP::P_;
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar11 = *(uint *)&pMVar7->field_0x8;
  uVar23 = uVar11 & 0xfffffffe;
  uVar10 = *(uint *)&pMVar7->field_0xc;
  local_e8 = uVar10 & 0x80000001;
  uVar19 = (long)(int)uVar10 & 0xfffffffffffffffe;
  uVar14 = 0;
  iVar21 = (int)uVar19;
  if (0 < (int)uVar23) {
    pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar24 = *(long *)&pMVar6->field_0x10;
    lVar12 = **(long **)&pMVar6->field_0x48;
    lVar16 = *(long *)&pMVar7->field_0x10;
    lVar28 = **(long **)&pMVar7->field_0x48;
    lVar27 = lVar16 + lVar28;
    lVar22 = lVar24 + 1 + lVar12;
    lVar15 = lVar24 + 1;
    uVar25 = 0;
    lVar29 = lVar16;
    do {
      puVar9 = RemSP::P_;
      lVar17 = lVar28 * uVar25 + lVar16;
      lVar1 = lVar17 + lVar28;
      if (iVar21 < 1) {
        uVar32 = 0;
      }
      else {
        uVar32 = 0;
        do {
          lVar30 = (long)*(int *)(lVar29 + uVar32 * 4);
          if (lVar30 < 1) {
            *(undefined8 *)(lVar29 + uVar32 * 4) = 0;
            uVar13 = uVar32 + 1;
            *(undefined4 *)(lVar27 + uVar32 * 4) = 0;
            uVar18 = 0;
          }
          else {
            uVar5 = puVar9[lVar30];
            uVar26 = uVar5;
            if (*(char *)(lVar15 + -1 + uVar32) == '\0') {
              uVar26 = 0;
            }
            *(uint *)(lVar29 + uVar32 * 4) = uVar26;
            uVar13 = uVar32 | 1;
            uVar26 = uVar5;
            if (*(char *)(lVar15 + uVar32) == '\0') {
              uVar26 = 0;
            }
            *(uint *)(lVar29 + 4 + uVar32 * 4) = uVar26;
            uVar26 = uVar5;
            if (*(char *)(lVar22 + -1 + uVar32) == '\0') {
              uVar26 = 0;
            }
            *(uint *)(lVar27 + uVar32 * 4) = uVar26;
            uVar20 = (ulong)uVar5;
            if (*(char *)(lVar22 + uVar32) == '\0') {
              uVar20 = uVar14;
            }
            uVar18 = (undefined4)uVar20;
          }
          *(undefined4 *)(lVar1 + uVar13 * 4) = uVar18;
          uVar32 = uVar32 + 2;
        } while ((long)uVar32 < (long)uVar19);
      }
      if (local_e8 == 1) {
        lVar30 = (long)*(int *)(lVar17 + uVar32 * 4);
        if (lVar30 < 1) {
          *(undefined4 *)(lVar17 + uVar32 * 4) = 0;
          *(undefined4 *)(lVar1 + uVar32 * 4) = 0;
        }
        else {
          lVar31 = lVar12 * uVar25 + lVar24;
          uVar5 = puVar8[lVar30];
          uVar13 = (ulong)uVar5;
          if (*(char *)(lVar31 + uVar32) == '\0') {
            uVar13 = uVar14;
          }
          *(int *)(lVar17 + uVar32 * 4) = (int)uVar13;
          if (*(char *)(lVar31 + lVar12 + uVar32) == '\0') {
            *(undefined4 *)(lVar1 + uVar32 * 4) = 0;
          }
          else {
            *(uint *)(lVar1 + uVar32 * 4) = uVar5;
          }
        }
      }
      uVar25 = uVar25 + 2;
      lVar27 = lVar27 + lVar28 * 2;
      lVar22 = lVar22 + lVar12 * 2;
      lVar15 = lVar15 + lVar12 * 2;
      lVar29 = lVar29 + lVar28 * 2;
    } while (uVar25 < uVar23);
    uVar14 = uVar25 & 0xffffffff;
  }
  puVar8 = RemSP::P_;
  if ((uVar11 & 0x80000001) == 1) {
    pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar27 = *(long *)&pMVar6->field_0x10;
    lVar12 = **(long **)&pMVar6->field_0x48 * uVar14;
    lVar22 = *(long *)&pMVar7->field_0x10;
    lVar24 = uVar14 * **(long **)&pMVar7->field_0x48;
    if (iVar21 < 1) {
      uVar14 = 0;
    }
    else {
      lVar16 = lVar12 + lVar27;
      lVar28 = lVar24 + lVar22;
      uVar14 = 0;
      do {
        lVar29 = (long)*(int *)(lVar28 + uVar14 * 4);
        if (lVar29 < 1) {
          *(undefined8 *)(lVar28 + uVar14 * 4) = 0;
        }
        else {
          uVar11 = puVar8[lVar29];
          uVar23 = uVar11;
          if (*(char *)(lVar16 + uVar14) == '\0') {
            uVar23 = 0;
          }
          *(uint *)(lVar28 + uVar14 * 4) = uVar23;
          if (*(char *)(lVar16 + 1 + uVar14) == '\0') {
            *(undefined4 *)(lVar28 + 4 + uVar14 * 4) = 0;
          }
          else {
            *(uint *)(lVar28 + 4 + uVar14 * 4) = uVar11;
          }
        }
        uVar14 = uVar14 + 2;
      } while (uVar14 < ((long)(int)uVar10 & 0xfffffffeU));
    }
    if (local_e8 == 1) {
      lVar22 = lVar22 + lVar24;
      lVar24 = (long)*(int *)(lVar22 + uVar14 * 4);
      uVar11 = 0;
      if ((0 < lVar24) && (uVar11 = 0, *(char *)(lVar27 + lVar12 + uVar14) != '\0')) {
        uVar11 = RemSP::P_[lVar24];
      }
      *(uint *)(lVar22 + uVar14 * 4) = uVar11;
    }
  }
  if (RemSP::P_ != (uint *)0x0) {
    operator_delete__(RemSP::P_);
  }
  return;
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

                               // We work with 2x2 blocks
                               // +-+-+-+
                               // |P|Q|R|
                               // +-+-+-+
                               // |S|X|
                               // +-+-+

                               // The pixels are named as follows
                               // +---+---+---+
                               // |a b|c d|e f|
                               // |g h|i j|k l|
                               // +---+---+---+
                               // |m n|o p|
                               // |q r|s t|
                               // +---+---+

                               // Pixels a, f, l, q are not needed, since we need to understand the
                               // the connectivity between these blocks and those pixels only matter
                               // when considering the outer connectivities

                               // A bunch of defines used to check if the pixels are foreground,
                               // without going outside the image limits.

                               // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_bolelli_2018_drag.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;
        int e_cols = img_labels_.cols & 0xfffffffe;
        bool o_cols = img_labels_.cols % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }

        LabelsSolver::Dealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }